

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MosquitoNet.h
# Opt level: O0

void __thiscall
Enhedron::Test::Impl::Impl_Suite::ContextResultsRecorder::fail
          (ContextResultsRecorder *this,string *given,NameStack *whenStack,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *description,string *expressionText,
          vector<Enhedron::Assertion::Impl::Configurable::Variable,_std::allocator<Enhedron::Assertion::Impl::Configurable::Variable>_>
          *variableList)

{
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *poVar1
  ;
  NameStack *pNVar2;
  Results *pRVar3;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  vector<Enhedron::Assertion::Impl::Configurable::Variable,_std::allocator<Enhedron::Assertion::Impl::Configurable::Variable>_>
  *local_38;
  vector<Enhedron::Assertion::Impl::Configurable::Variable,_std::allocator<Enhedron::Assertion::Impl::Configurable::Variable>_>
  *variableList_local;
  string *expressionText_local;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *description_local;
  NameStack *whenStack_local;
  string *given_local;
  ContextResultsRecorder *this_local;
  
  local_38 = variableList;
  variableList_local =
       (vector<Enhedron::Assertion::Impl::Configurable::Variable,_std::allocator<Enhedron::Assertion::Impl::Configurable::Variable>_>
        *)expressionText;
  expressionText_local = (string *)description;
  description_local =
       (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
       )whenStack;
  whenStack_local = (NameStack *)given;
  given_local = (string *)this;
  pRVar3 = Enhedron::Impl::Util::Out<Enhedron::Test::Impl::Impl_Results::Results>::operator->
                     (&this->results_);
  pNVar2 = whenStack_local;
  poVar1 = description_local;
  Util::Impl::Impl_Optional::
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&local_40,description);
  (*pRVar3->_vptr_Results[10])
            (pRVar3,&this->contextStack_,pNVar2,poVar1,&local_40,variableList_local,local_38);
  Util::Impl::Impl_Optional::
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_40);
  return;
}

Assistant:

virtual void fail(const string& given,
                          const NameStack& whenStack,
                          optional<string> description,
                          const string &expressionText,
                          const vector <Variable> &variableList) {
            return results_->fail(contextStack_, given, whenStack, description, expressionText, variableList);
        }